

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
operator==(GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs)

{
  ushort uVar1;
  ushort uVar2;
  Pointer pVVar3;
  ConstMemberIterator CVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  SizeType index;
  Pointer pVVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  Pointer local_38;
  
  uVar1 = *(ushort *)(this + 0xe);
  uVar2 = (rhs->data_).f.flags;
  if ((uVar1 & 7) != (uVar2 & 7)) goto LAB_0013caf5;
  bVar6 = true;
  switch(uVar1 & 7) {
  case 3:
    if (*(SizeType *)this == (rhs->data_).s.length) {
      if (uVar1 != 3) {
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                      ,0x4f4,
                      "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      pVVar5 = (Pointer)(*(ulong *)(this + 8) & 0xffffffffffff);
      CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)this);
      if (CVar4.ptr_ == pVVar5) {
        return true;
      }
      while( true ) {
        FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&local_38,rhs);
        pVVar3 = local_38;
        CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd(rhs);
        if ((pVVar3 == CVar4.ptr_) ||
           (bVar6 = operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&pVVar5->value,&pVVar3->value), !bVar6)) break;
        CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this);
        pVVar5 = pVVar5 + 1;
        if (pVVar5 == CVar4.ptr_) {
          return true;
        }
      }
    }
    break;
  case 4:
    if (*(SizeType *)this == (rhs->data_).s.length) {
      if (*(SizeType *)this == 0) {
        return true;
      }
      index = 0;
      do {
        this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   *)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)this,index);
        rhs_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](rhs,index);
        bVar6 = operator==(this_00,rhs_00);
        if (!bVar6) {
          return bVar6;
        }
        index = index + 1;
      } while (index < *(uint *)this);
      return bVar6;
    }
    break;
  case 5:
    bVar6 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(this,rhs);
    return bVar6;
  case 6:
    if (((uVar2 | uVar1) >> 9 & 1) == 0) {
      bVar6 = *(long *)this == (rhs->data_).n.i64;
    }
    else {
      dVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)this);
      dVar8 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(rhs);
      bVar6 = (bool)(-(dVar8 == dVar7) & 1);
    }
  default:
    goto switchD_0013ca00_default;
  }
LAB_0013caf5:
  bVar6 = false;
switchD_0013ca00_default:
  return bVar6;
}

Assistant:

bool operator==(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        typedef GenericValue<Encoding, SourceAllocator> RhsType;
        if (GetType() != rhs.GetType())
            return false;

        switch (GetType()) {
        case kObjectType: // Warning: O(n^2) inner-loop
            if (data_.o.size != rhs.data_.o.size)
                return false;           
            for (ConstMemberIterator lhsMemberItr = MemberBegin(); lhsMemberItr != MemberEnd(); ++lhsMemberItr) {
                typename RhsType::ConstMemberIterator rhsMemberItr = rhs.FindMember(lhsMemberItr->name);
                if (rhsMemberItr == rhs.MemberEnd() || (!(lhsMemberItr->value == rhsMemberItr->value)))
                    return false;
            }
            return true;
            
        case kArrayType:
            if (data_.a.size != rhs.data_.a.size)
                return false;
            for (SizeType i = 0; i < data_.a.size; i++)
                if (!((*this)[i] == rhs[i]))
                    return false;
            return true;

        case kStringType:
            return StringEqual(rhs);

        case kNumberType:
            if (IsDouble() || rhs.IsDouble()) {
                double a = GetDouble();     // May convert from integer to double.
                double b = rhs.GetDouble(); // Ditto
                return a >= b && a <= b;    // Prevent -Wfloat-equal
            }
            else
                return data_.n.u64 == rhs.data_.n.u64;

        default:
            return true;
        }
    }